

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::
holder<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
::to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          holder<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
          *this)

{
  long lVar1;
  long lVar2;
  const_iterator __begin1;
  string str;
  iterator local_110;
  _Alloc_hider local_100;
  size_type local_f8;
  char local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  pair<cs_impl::any,_cs_impl::any> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (*(long *)(this + 0x18) == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"cs::hash_map => {}",(allocator *)&local_d0);
  }
  else {
    std::__cxx11::string::string((string *)&local_100,"cs::hash_map => {",(allocator *)&local_d0);
    local_110 = phmap::priv::
                raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                         *)(this + 8));
    lVar1 = *(long *)(this + 8);
    lVar2 = *(long *)(this + 0x20);
    while (local_110.ctrl_ != (ctrl_t *)(lVar1 + lVar2)) {
      std::pair<cs_impl::any,_cs_impl::any>::pair<const_cs_impl::any,_cs_impl::any,_true>
                (&local_e0,(pair<const_cs_impl::any,_cs_impl::any> *)local_110.field_1.slot_);
      any::to_string_abi_cxx11_(&local_50,&local_e0.first);
      std::operator+(&local_d0,&local_50," : ");
      any::to_string_abi_cxx11_(&local_70,&local_e0.second);
      std::operator+(&local_b0,&local_d0,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_90,&local_b0,", ");
      std::__cxx11::string::append((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::pair<cs_impl::any,_cs_impl::any>::~pair(&local_e0);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ::iterator::operator++(&local_110);
    }
    std::__cxx11::string::resize((ulong)&local_100);
    std::__cxx11::string::append((char *)&local_100);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_100._M_p == &local_f0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_ef,local_f0);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_e8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_100._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_ef,local_f0);
    }
    __return_storage_ptr__->_M_string_length = local_f8;
    local_f8 = 0;
    local_f0 = '\0';
    local_100._M_p = &local_f0;
    std::__cxx11::string::~string((string *)&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}